

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O3

XCKernel __thiscall ExchCXX::libxc_kernel_factory(ExchCXX *this,string *xc_name,Spin spin_polar)

{
  pointer pcVar1;
  int iVar2;
  tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  this_00;
  exchcxx_exception *this_01;
  __uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  local_b0;
  string local_a8;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  pcVar1 = (xc_name->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + xc_name->_M_string_length);
  iVar2 = xc_functional_get_number((char *)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (iVar2 != -1) {
    this_00.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )operator_new(0x1b8);
    pcVar1 = (xc_name->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + xc_name->_M_string_length);
    detail::LibxcKernelImpl::LibxcKernelImpl
              ((LibxcKernelImpl *)
               this_00.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,&local_88
               ,spin_polar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_t.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )(tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            )this_00.
             super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
             .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl;
    XCKernel::XCKernel((XCKernel *)this,(impl_ptr *)&local_b0);
    if ((_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
         )local_b0._M_t.
          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl !=
        (XCKernelImpl *)0x0) {
      (**(code **)(*(long *)local_b0._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 8))();
    }
    return (impl_ptr)(impl_ptr)this;
  }
  this_01 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"LibXC FUNCTIONAL NOT FOUND","");
  exchcxx_exception::exchcxx_exception(this_01,&local_a8,0x85,&local_48);
  __cxa_throw(this_01,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

XCKernel libxc_kernel_factory( const std::string xc_name,
  const Spin spin_polar ) {

  EXCHCXX_BOOL_CHECK( "LibXC FUNCTIONAL NOT FOUND", libxc_supports_functional(xc_name) )

  return XCKernel(
      std::make_unique< detail::LibxcKernelImpl >( xc_name, spin_polar ) );

}